

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

void unset_replace_list(dmr_C *C,symbol_list *list)

{
  undefined1 local_38 [8];
  ptr_list_iter symiter__;
  symbol *sym;
  symbol_list *list_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)list);
  symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_38);
  while (symiter__._16_8_ != 0) {
    unset_replace(C,(symbol *)symiter__._16_8_);
    symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_38);
  }
  return;
}

Assistant:

static void unset_replace_list(struct dmr_C *C, struct symbol_list *list)
{
	struct symbol *sym;
	FOR_EACH_PTR(list, sym) {
		unset_replace(C, sym);
	} END_FOR_EACH_PTR(sym);
}